

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_hexamine.cc
# Opt level: O0

void decode_dblock(void *block)

{
  int iVar1;
  ulong *in_RDI;
  size_t idx;
  size_t subblock_no;
  dblock *_db;
  size_t local_20;
  size_t local_18;
  ulong *local_10;
  ulong *local_8;
  
  *in_RDI = *in_RDI >> 0x38 | (*in_RDI & 0xff000000000000) >> 0x28 |
            (*in_RDI & 0xff0000000000) >> 0x18 | (*in_RDI & 0xff00000000) >> 8 |
            (*in_RDI & 0xff000000) << 8 | (*in_RDI & 0xff0000) << 0x18 | (*in_RDI & 0xff00) << 0x28
            | *in_RDI << 0x38;
  in_RDI[1] = in_RDI[1] >> 0x38 | (in_RDI[1] & 0xff000000000000) >> 0x28 |
              (in_RDI[1] & 0xff0000000000) >> 0x18 | (in_RDI[1] & 0xff00000000) >> 8 |
              (in_RDI[1] & 0xff000000) << 8 | (in_RDI[1] & 0xff0000) << 0x18 |
              (in_RDI[1] & 0xff00) << 0x28 | in_RDI[1] << 0x38;
  in_RDI[2] = in_RDI[2] >> 0x38 | (in_RDI[2] & 0xff000000000000) >> 0x28 |
              (in_RDI[2] & 0xff0000000000) >> 0x18 | (in_RDI[2] & 0xff00000000) >> 8 |
              (in_RDI[2] & 0xff000000) << 8 | (in_RDI[2] & 0xff0000) << 0x18 |
              (in_RDI[2] & 0xff00) << 0x28 | in_RDI[2] << 0x38;
  in_RDI[3] = in_RDI[3] >> 0x38 | (in_RDI[3] & 0xff000000000000) >> 0x28 |
              (in_RDI[3] & 0xff0000000000) >> 0x18 | (in_RDI[3] & 0xff00000000) >> 8 |
              (in_RDI[3] & 0xff000000) << 8 | (in_RDI[3] & 0xff0000) << 0x18 |
              (in_RDI[3] & 0xff00) << 0x28 | in_RDI[3] << 0x38;
  in_RDI[4] = in_RDI[4] >> 0x38 | (in_RDI[4] & 0xff000000000000) >> 0x28 |
              (in_RDI[4] & 0xff0000000000) >> 0x18 | (in_RDI[4] & 0xff00000000) >> 8 |
              (in_RDI[4] & 0xff000000) << 8 | (in_RDI[4] & 0xff0000) << 0x18 |
              (in_RDI[4] & 0xff00) << 0x28 | in_RDI[4] << 0x38;
  in_RDI[5] = in_RDI[5] >> 0x38 | (in_RDI[5] & 0xff000000000000) >> 0x28 |
              (in_RDI[5] & 0xff0000000000) >> 0x18 | (in_RDI[5] & 0xff00000000) >> 8 |
              (in_RDI[5] & 0xff000000) << 8 | (in_RDI[5] & 0xff0000) << 0x18 |
              (in_RDI[5] & 0xff00) << 0x28 | in_RDI[5] << 0x38;
  in_RDI[6] = in_RDI[6] >> 0x38 | (in_RDI[6] & 0xff000000000000) >> 0x28 |
              (in_RDI[6] & 0xff0000000000) >> 0x18 | (in_RDI[6] & 0xff00000000) >> 8 |
              (in_RDI[6] & 0xff000000) << 8 | (in_RDI[6] & 0xff0000) << 0x18 |
              (in_RDI[6] & 0xff00) << 0x28 | in_RDI[6] << 0x38;
  in_RDI[7] = in_RDI[7] >> 0x38 | (in_RDI[7] & 0xff000000000000) >> 0x28 |
              (in_RDI[7] & 0xff0000000000) >> 0x18 | (in_RDI[7] & 0xff00000000) >> 8 |
              (in_RDI[7] & 0xff000000) << 8 | (in_RDI[7] & 0xff0000) << 0x18 |
              (in_RDI[7] & 0xff00) << 0x28 | in_RDI[7] << 0x38;
  in_RDI[8] = in_RDI[8] >> 0x38 | (in_RDI[8] & 0xff000000000000) >> 0x28 |
              (in_RDI[8] & 0xff0000000000) >> 0x18 | (in_RDI[8] & 0xff00000000) >> 8 |
              (in_RDI[8] & 0xff000000) << 8 | (in_RDI[8] & 0xff0000) << 0x18 |
              (in_RDI[8] & 0xff00) << 0x28 | in_RDI[8] << 0x38;
  in_RDI[9] = in_RDI[9] >> 0x38 | (in_RDI[9] & 0xff000000000000) >> 0x28 |
              (in_RDI[9] & 0xff0000000000) >> 0x18 | (in_RDI[9] & 0xff00000000) >> 8 |
              (in_RDI[9] & 0xff000000) << 8 | (in_RDI[9] & 0xff0000) << 0x18 |
              (in_RDI[9] & 0xff00) << 0x28 | in_RDI[9] << 0x38;
  *(ushort *)(in_RDI + 10) = (ushort)in_RDI[10] >> 8 | (short)in_RDI[10] << 8;
  *(ushort *)((long)in_RDI + 0x52) =
       *(ushort *)((long)in_RDI + 0x52) >> 8 | *(short *)((long)in_RDI + 0x52) << 8;
  local_10 = in_RDI;
  local_8 = in_RDI;
  iVar1 = is_subblock(*in_RDI);
  if (iVar1 == 0) {
    *(ulong *)((long)local_10 + 0xfc5) = *local_10;
    *(undefined8 *)((long)local_10 + 0xfcd) = 0;
    *(undefined8 *)((long)local_10 + 0xfd5) = 0;
  }
  else {
    subbid2bid(*local_10,&local_18,&local_20,(bid_t *)((long)local_10 + 0xfc5));
    *(size_t *)((long)local_10 + 0xfcd) = local_18;
    *(size_t *)((long)local_10 + 0xfd5) = local_20;
  }
  iVar1 = is_subblock(local_10[1]);
  if (iVar1 == 0) {
    *(ulong *)((long)local_10 + 0xfdd) = *local_10;
    *(undefined8 *)((long)local_10 + 0xfe5) = 0;
    *(undefined8 *)((long)local_10 + 0xfed) = 0;
  }
  else {
    subbid2bid(local_10[1],&local_18,&local_20,(bid_t *)((long)local_10 + 0xfdd));
    *(size_t *)((long)local_10 + 0xfe5) = local_18;
    *(size_t *)((long)local_10 + 0xfed) = local_20;
  }
  *(ulong *)((long)local_10 + 0xff5) =
       *(ulong *)((long)local_10 + 0xff5) >> 0x38 |
       (*(ulong *)((long)local_10 + 0xff5) & 0xff000000000000) >> 0x28 |
       (*(ulong *)((long)local_10 + 0xff5) & 0xff0000000000) >> 0x18 |
       (*(ulong *)((long)local_10 + 0xff5) & 0xff00000000) >> 8 |
       (*(ulong *)((long)local_10 + 0xff5) & 0xff000000) << 8 |
       (*(ulong *)((long)local_10 + 0xff5) & 0xff0000) << 0x18 |
       (*(ulong *)((long)local_10 + 0xff5) & 0xff00) << 0x28 |
       *(long *)((long)local_10 + 0xff5) << 0x38;
  *(ulong *)((long)local_10 + 0xffd) =
       *(ulong *)((long)local_10 + 0xffd) >> 0x38 |
       (*(ulong *)((long)local_10 + 0xffd) & 0xff000000000000) >> 0x28 |
       (*(ulong *)((long)local_10 + 0xffd) & 0xff0000000000) >> 0x18 |
       (*(ulong *)((long)local_10 + 0xffd) & 0xff00000000) >> 8 |
       (*(ulong *)((long)local_10 + 0xffd) & 0xff000000) << 8 |
       (*(ulong *)((long)local_10 + 0xffd) & 0xff0000) << 0x18 |
       (*(ulong *)((long)local_10 + 0xffd) & 0xff00) << 0x28 |
       *(long *)((long)local_10 + 0xffd) << 0x38;
  *(ulong *)((long)local_10 + 0x1007) =
       *(ulong *)((long)local_10 + 0x1007) >> 0x38 |
       (*(ulong *)((long)local_10 + 0x1007) & 0xff000000000000) >> 0x28 |
       (*(ulong *)((long)local_10 + 0x1007) & 0xff0000000000) >> 0x18 |
       (*(ulong *)((long)local_10 + 0x1007) & 0xff00000000) >> 8 |
       (*(ulong *)((long)local_10 + 0x1007) & 0xff000000) << 8 |
       (*(ulong *)((long)local_10 + 0x1007) & 0xff0000) << 0x18 |
       (*(ulong *)((long)local_10 + 0x1007) & 0xff00) << 0x28 |
       *(long *)((long)local_10 + 0x1007) << 0x38;
  *(ushort *)((long)local_10 + 0x1005) =
       *(ushort *)((long)local_10 + 0x1005) >> 8 | *(short *)((long)local_10 + 0x1005) << 8;
  *(undefined8 *)((long)local_10 + 0xfb5) =
       *(undefined8 *)((long)local_8 + (long)(int)(uint)*(ushort *)((long)local_10 + 0x1005));
  *(ulong *)((long)local_10 + 0xfb5) =
       *(ulong *)((long)local_10 + 0xfb5) >> 0x38 |
       (*(ulong *)((long)local_10 + 0xfb5) & 0xff000000000000) >> 0x28 |
       (*(ulong *)((long)local_10 + 0xfb5) & 0xff0000000000) >> 0x18 |
       (*(ulong *)((long)local_10 + 0xfb5) & 0xff00000000) >> 8 |
       (*(ulong *)((long)local_10 + 0xfb5) & 0xff000000) << 8 |
       (*(ulong *)((long)local_10 + 0xfb5) & 0xff0000) << 0x18 |
       (*(ulong *)((long)local_10 + 0xfb5) & 0xff00) << 0x28 |
       *(long *)((long)local_10 + 0xfb5) << 0x38;
  *(undefined8 *)((long)local_10 + 0xfbd) =
       *(undefined8 *)((long)local_8 + (long)(int)(uint)*(ushort *)((long)local_10 + 0x1005) + 8);
  *(ulong *)((long)local_10 + 0xfbd) =
       *(ulong *)((long)local_10 + 0xfbd) >> 0x38 |
       (*(ulong *)((long)local_10 + 0xfbd) & 0xff000000000000) >> 0x28 |
       (*(ulong *)((long)local_10 + 0xfbd) & 0xff0000000000) >> 0x18 |
       (*(ulong *)((long)local_10 + 0xfbd) & 0xff00000000) >> 8 |
       (*(ulong *)((long)local_10 + 0xfbd) & 0xff000000) << 8 |
       (*(ulong *)((long)local_10 + 0xfbd) & 0xff0000) << 0x18 |
       (*(ulong *)((long)local_10 + 0xfbd) & 0xff00) << 0x28 |
       *(long *)((long)local_10 + 0xfbd) << 0x38;
  return;
}

Assistant:

void decode_dblock(void *block) {
    dblock *_db = (dblock *)block;
    size_t subblock_no, idx;
    _db->trie_root_raw = _endian_decode(_db->trie_root_raw);
    _db->seqtree_root_raw =_endian_decode(_db->seqtree_root_raw);
    _db->staletree_root_raw=_endian_decode(_db->staletree_root_raw);
    _db->num_docs = _endian_decode(_db->num_docs);
    _db->num_deletes = _endian_decode(_db->num_deletes);
    _db->num_nodes = _endian_decode(_db->num_nodes);
    _db->data_size = _endian_decode(_db->data_size);
    _db->last_wal_flush_bid = _endian_decode(_db->
            last_wal_flush_bid);
    _db->kv_info_offset = _endian_decode(_db->kv_info_offset);
    _db->hdr_flags = _endian_decode(_db->hdr_flags);

    _db->new_filename_len = _endian_decode(_db->new_filename_len);
    _db->old_filename_len = _endian_decode(_db->old_filename_len);
    if (!is_subblock(_db->trie_root_raw)) {
        _db->trie_root_bid = _db->trie_root_raw;
        _db->trie_subblock_no = 0;
        _db->trie_idx = 0;
    } else {
        subbid2bid(_db->trie_root_raw,
                   &subblock_no,
                   &idx,
                   &_db->trie_root_bid);
        _db->trie_subblock_no = subblock_no;
        _db->trie_idx = idx;
    }
    if (!is_subblock(_db->seqtree_root_raw)) {
        _db->seqtree_root_bid = _db->trie_root_raw;
        _db->seqtree_subblock_no = 0;
        _db->seqtree_idx = 0;
    } else {
        subbid2bid(_db->seqtree_root_raw,
                   &subblock_no,
                   &idx,
                   &_db->seqtree_root_bid);
        _db->seqtree_subblock_no = subblock_no;
        _db->seqtree_idx = idx;
    }
    _db->delta_size = _endian_decode(_db->delta_size);
    _db->prev_hdr_bid = _endian_decode(_db->prev_hdr_bid);
    _db->magic_bytes = _endian_decode(_db->magic_bytes);
    _db->hdr_len = _endian_decode(_db->hdr_len);
    _db->revnum = *(uint64_t*)((char*)block + _db->hdr_len);
    _db->revnum = _endian_decode(_db->revnum);
    _db->seqnum = *(uint64_t*)((char*)block + _db->hdr_len + sizeof(uint64_t));
    _db->seqnum = _endian_decode(_db->seqnum);
}